

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR xpath_deref(lyxp_set **args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  ly_ctx *plVar1;
  ly_bool lVar2;
  LY_ERR LVar3;
  char *pcVar4;
  void *local_a0;
  uint local_84;
  LY_ERR ret__;
  uint32_t i;
  ly_set *targets;
  LY_ERR local_70;
  LY_ERR ret;
  LY_ERR r;
  uint8_t oper;
  char *errmsg;
  lyd_node *node;
  ly_path *p;
  lysc_node *target;
  lysc_type_leafref *lref;
  lysc_node_leaf *sleaf;
  lyd_node_term *leaf;
  lyxp_set *plStack_28;
  uint32_t options_local;
  lyxp_set *set_local;
  lyxp_set **pplStack_18;
  uint32_t UNUSED_arg_count_local;
  lyxp_set **args_local;
  
  lref = (lysc_type_leafref *)0x0;
  _r = (char *)0x0;
  targets._4_4_ = LY_SUCCESS;
  _ret__ = (ly_set *)0x0;
  leaf._4_4_ = options;
  plStack_28 = set;
  set_local._4_4_ = UNUSED_arg_count;
  pplStack_18 = args;
  if ((options & 0x1c) == 0) {
    if ((*args)->type == LYXP_SET_NODE_SET) {
      lyxp_set_free_content(set);
      if ((*pplStack_18)->used != 0) {
        sleaf = (lysc_node_leaf *)(((*pplStack_18)->val).scnodes)->scnode;
        lref = (lysc_type_leafref *)(sleaf->field_0).node.module;
        if (((ulong)((lys_module *)lref)->ctx & 0xc) != 0) {
          if (*(int *)&((lys_module *)lref)->identities->module == 0xe) {
            local_70 = lyplg_type_resolve_leafref
                                 ((lysc_type_leafref *)((lys_module *)lref)->identities,
                                  (lyd_node *)sleaf,(lyd_value *)((long)&sleaf->field_0 + 0x38),
                                  plStack_28->tree,(ly_set **)&ret__,(char **)&r);
            if (local_70 == LY_SUCCESS) {
              for (local_84 = 0; local_84 < _ret__->count; local_84 = local_84 + 1) {
                set_insert_node(plStack_28,(_ret__->field_2).dnodes[local_84],0,LYXP_NODE_ELEM,0);
              }
            }
            else {
              ly_log(plStack_28->ctx,LY_LLERR,LY_EINVAL,"%s",_r);
              free(_r);
              targets._4_4_ = LY_EINVAL;
            }
          }
          else {
            if (*(int *)&((lys_module *)lref)->identities->module != 0xd) {
              __assert_fail("sleaf->type->basetype == LY_TYPE_INST",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0xff3,
                            "LY_ERR xpath_deref(struct lyxp_set **, uint32_t, struct lyxp_set *, uint32_t)"
                           );
            }
            LVar3 = ly_path_eval((ly_path *)(sleaf->field_0).node.priv,plStack_28->tree,
                                 (lyxp_var *)0x0,(lyd_node **)&errmsg);
            if (LVar3 == LY_SUCCESS) {
              set_insert_node(plStack_28,(lyd_node *)errmsg,0,LYXP_NODE_ELEM,0);
            }
            else {
              plVar1 = plStack_28->ctx;
              pcVar4 = lyd_get_value((lyd_node *)sleaf);
              ly_log(plVar1,LY_LLERR,LY_EINVAL,
                     "Invalid instance-identifier \"%s\" value - required instance not found.",
                     pcVar4);
              targets._4_4_ = LY_EINVAL;
            }
          }
        }
      }
    }
    else {
      plVar1 = set->ctx;
      pcVar4 = print_set_type(*args);
      ly_vlog(plVar1,(char *)0x0,LYVE_XPATH,
              "Wrong type of argument #%d (%s) for the XPath function %s.",1,pcVar4,
              "deref(node-set)");
      targets._4_4_ = LY_EVALID;
    }
  }
  else {
    if ((*args)->type == LYXP_SET_SCNODE_SET) {
      lref = (lysc_type_leafref *)warn_get_scnode_in_ctx(*args);
      if ((lysc_node *)lref != (lysc_node *)0x0) {
        if ((((lysc_node *)lref)->nodetype & 0xc) == 0) {
          plVar1 = plStack_28->ctx;
          pcVar4 = lys_nodetype2str(((lysc_node *)lref)->nodetype);
          ly_log(plVar1,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s is a %s node \"%s\".","xpath_deref",
                 pcVar4,lref->prefixes);
        }
        else {
          lVar2 = warn_is_specific_type
                            ((lysc_type *)((lysc_node *)((long)lref + 0x50))->parent,LY_TYPE_LEAFREF
                            );
          if ((lVar2 == '\0') &&
             (lVar2 = warn_is_specific_type((lysc_type *)lref[1].path,LY_TYPE_INST), lVar2 == '\0'))
          {
            ly_log(plStack_28->ctx,LY_LLWRN,LY_SUCCESS,
                   "Argument #1 of %s is node \"%s\", not of type \"leafref\" nor \"instance-identifier\"."
                   ,"xpath_deref",lref->prefixes);
          }
        }
      }
    }
    else {
      ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s not a node-set as expected.",
             "xpath_deref");
    }
    set_scnode_clear_ctx(plStack_28,1);
    if (((lref != (lysc_type_leafref *)0x0) && (((ulong)lref->name & 0xc) != 0)) &&
       (*(int *)&(lref[1].path)->repeat == 0xe)) {
      target = (lysc_node *)lref[1].path;
      ret._3_1_ = 1;
      if (((ulong)lref->name & 0x20000000) != 0) {
        ret._3_1_ = 2;
      }
      local_70 = ly_path_compile_leafref
                           (plStack_28->ctx,(lysc_node *)lref,(lysc_ext_instance *)0x0,
                            (lyxp_expr *)target->prev,(ushort)(byte)ret._3_1_,0x20,
                            LY_VALUE_SCHEMA_RESOLVED,target->name,(ly_path **)&node);
      if (local_70 == LY_SUCCESS) {
        if (node == (lyd_node *)0x0) {
          local_a0 = (void *)0x0;
        }
        else {
          local_a0 = node[-1].priv;
        }
        p = *(ly_path **)((long)node + ((long)local_a0 + -1) * 0x18);
        ly_path_free((ly_path *)node);
        LVar3 = lyxp_set_scnode_insert_node
                          (plStack_28,(lysc_node *)p,LYXP_NODE_ELEM,LYXP_AXIS_SELF,(uint32_t *)0x0);
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
      }
    }
    targets._4_4_ = LY_SUCCESS;
  }
  ly_set_free(_ret__,(_func_void_void_ptr *)0x0);
  return targets._4_4_;
}

Assistant:

static LY_ERR
xpath_deref(struct lyxp_set **args, uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    struct lyd_node_term *leaf;
    struct lysc_node_leaf *sleaf = NULL;
    struct lysc_type_leafref *lref;
    const struct lysc_node *target;
    struct ly_path *p;
    struct lyd_node *node;
    char *errmsg = NULL;
    uint8_t oper;
    LY_ERR r;
    LY_ERR ret = LY_SUCCESS;
    struct ly_set *targets = NULL;
    uint32_t i;

    if (options & LYXP_SCNODE_ALL) {
        if (args[0]->type != LYXP_SET_SCNODE_SET) {
            LOGWRN(set->ctx, "Argument #1 of %s not a node-set as expected.", __func__);
        } else if ((sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & LYD_NODE_TERM)) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype),
                        sleaf->name);
            } else if (!warn_is_specific_type(sleaf->type, LY_TYPE_LEAFREF) &&
                    !warn_is_specific_type(sleaf->type, LY_TYPE_INST)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of type \"leafref\" nor \"instance-identifier\".",
                        __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        if (sleaf && (sleaf->nodetype & LYD_NODE_TERM) && (sleaf->type->basetype == LY_TYPE_LEAFREF)) {
            lref = (struct lysc_type_leafref *)sleaf->type;
            oper = (sleaf->flags & LYS_IS_OUTPUT) ? LY_PATH_OPER_OUTPUT : LY_PATH_OPER_INPUT;

            /* it was already evaluated on schema, it must succeed */
            r = ly_path_compile_leafref(set->ctx, &sleaf->node, NULL, lref->path, oper, LY_PATH_TARGET_MANY,
                    LY_VALUE_SCHEMA_RESOLVED, lref->prefixes, &p);
            if (!r) {
                /* get the target node */
                target = p[LY_ARRAY_COUNT(p) - 1].node;
                ly_path_free(p);

                LY_CHECK_RET(lyxp_set_scnode_insert_node(set, target, LYXP_NODE_ELEM, LYXP_AXIS_SELF, NULL));
            } /* else the target was found before but is disabled so it was removed */
        }

        ret = LY_SUCCESS;
        goto cleanup;
    }

    if (args[0]->type != LYXP_SET_NODE_SET) {
        LOGVAL(set->ctx, LY_VCODE_XP_INARGTYPE, 1, print_set_type(args[0]), "deref(node-set)");
        ret = LY_EVALID;
        goto cleanup;
    }

    lyxp_set_free_content(set);
    if (args[0]->used) {
        leaf = (struct lyd_node_term *)args[0]->val.nodes[0].node;
        sleaf = (struct lysc_node_leaf *)leaf->schema;
        if (sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
            if (sleaf->type->basetype == LY_TYPE_LEAFREF) {
                /* find leafref target */
                r = lyplg_type_resolve_leafref((struct lysc_type_leafref *)sleaf->type, &leaf->node, &leaf->value, set->tree,
                        &targets, &errmsg);
                if (r) {
                    LOGERR(set->ctx, LY_EINVAL, "%s", errmsg);
                    free(errmsg);
                    ret = LY_EINVAL;
                    goto cleanup;
                }

                /* insert nodes into set */
                for (i = 0; i < targets->count; ++i) {
                    set_insert_node(set, targets->dnodes[i], 0, LYXP_NODE_ELEM, 0);
                }
            } else {
                assert(sleaf->type->basetype == LY_TYPE_INST);
                if (ly_path_eval(leaf->value.target, set->tree, NULL, &node)) {
                    LOGERR(set->ctx, LY_EINVAL, "Invalid instance-identifier \"%s\" value - required instance not found.",
                            lyd_get_value(&leaf->node));
                    ret = LY_EINVAL;
                    goto cleanup;
                }

                /* insert it */
                set_insert_node(set, node, 0, LYXP_NODE_ELEM, 0);
            }
        }
    }

cleanup:
    ly_set_free(targets, NULL);
    return ret;
}